

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int UTF8ToUTF16LE(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  int iVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  
  iVar4 = (int)out;
  iVar5 = (int)in;
  iVar1 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (in == (uchar *)0x0) {
      *outlen = 0;
      iVar5 = 0;
      iVar1 = 0;
    }
    else {
      if (0 < (long)*inlen) {
        pbVar6 = in + *inlen;
        pbVar2 = out + ((long)*outlen & 0xfffffffffffffffe);
        iVar1 = -3;
        do {
          bVar9 = *in;
          if ((char)bVar9 < '\0') {
            if (bVar9 < 0xe0) {
              if (0xc1 < bVar9) {
                uVar13 = bVar9 & 0x1f;
                uVar11 = 0x80;
                lVar12 = 2;
                goto LAB_0012cae9;
              }
LAB_0012cb56:
              iVar3 = 4;
              iVar1 = -2;
            }
            else {
              lVar12 = 4 - (ulong)(bVar9 < 0xf0);
              uVar11 = 0x10000;
              if (bVar9 < 0xf0) {
                uVar11 = 0x800;
              }
              uVar13 = bVar9 & 0xf;
LAB_0012cae9:
              iVar3 = 3;
              if ((long)pbVar6 - (long)in < lVar12) goto LAB_0012cb5b;
              lVar7 = 1;
              do {
                uVar14 = uVar13;
                iVar3 = 4;
                if ((in[lVar7] & 0xc0) != 0x80) goto LAB_0012cb56;
                uVar10 = uVar14 << 6;
                uVar13 = in[lVar7] & 0x3f | uVar10;
                lVar7 = lVar7 + 1;
              } while (lVar12 != lVar7);
              if ((uVar13 < uVar11) || (0x10ffff < uVar10 || (uVar14 & 0x3ffffe0) == 0x360))
              goto LAB_0012cb56;
              bVar9 = (byte)(uVar10 >> 8);
              if (uVar10 < 0x10000) {
                if (out < pbVar2) {
                  *out = (byte)uVar13;
                  lVar8 = 2;
                  lVar7 = 1;
LAB_0012cbd6:
                  out[lVar7] = bVar9;
                  out = out + lVar8;
                  in = in + lVar12;
                  iVar3 = 0;
                }
              }
              else if (3 < (long)pbVar2 - (long)out) {
                *out = (byte)(uVar13 - 0x10000 >> 10);
                out[1] = (byte)(uVar13 - 0x10000 >> 0x12) | 0xd8;
                out[2] = (byte)uVar13;
                bVar9 = bVar9 & 3 | 0xdc;
                lVar8 = 4;
                lVar7 = 3;
                goto LAB_0012cbd6;
              }
            }
LAB_0012cb5b:
            if (iVar3 != 0) {
              if (iVar3 != 3) {
                if (iVar3 != 4) {
                  return iVar1;
                }
                goto LAB_0012cc05;
              }
              break;
            }
          }
          else {
            if (pbVar2 <= out) goto LAB_0012cc05;
            *out = bVar9;
            out[1] = 0;
            in = in + 1;
            out = out + 2;
          }
        } while (in < pbVar6);
      }
      iVar1 = (int)out - iVar4;
LAB_0012cc05:
      *outlen = (int)out - iVar4;
      iVar5 = (int)in - iVar5;
    }
    *inlen = iVar5;
  }
  return iVar1;
}

Assistant:

static int
UTF8ToUTF16LE(unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              void *vctxt ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend;
    unsigned char *outstart = out;
    unsigned char *outend;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    /* UTF16LE encoding has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + *inlen;
    outend = out + (*outlen & ~1);
    while (in < inend) {
        c = in[0];

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = c;
            out[1] = 0;
            in += 1;
            out += 2;
        } else {
            int i, len;
            unsigned min;

            if (c < 0xE0) {
                if (c < 0xC2) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c &= 0x1F;
                len = 2;
                min = 0x80;
            } else if (c < 0xF0) {
                c &= 0x0F;
                len = 3;
                min = 0x800;
            } else {
                c &= 0x0F;
                len = 4;
                min = 0x10000;
            }

            if (inend - in < len)
                break;

            for (i = 1; i < len; i++) {
                if ((in[i] & 0xC0) != 0x80) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c = (c << 6) | (in[i] & 0x3F);
            }

            if ((c < min) ||
                ((c >= 0xD800) && (c <= 0xDFFF)) ||
                (c > 0x10FFFF)) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }

            if (c < 0x10000) {
                if (out >= outend)
                    goto done;
                out[0] = c & 0xFF;
                out[1] = c >> 8;
                out += 2;
            } else {
                if (outend - out < 4)
                    goto done;
                c -= 0x10000;
                d = (c & 0x03FF) | 0xDC00;
                c = (c >> 10)    | 0xD800;
                out[0] = c & 0xFF;
                out[1] = c >> 8;
                out[2] = d & 0xFF;
                out[3] = d >> 8;
                out += 4;
            }

            in += len;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}